

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressmap-inl.h
# Opt level: O0

bool __thiscall
AddressMap<HeapProfileTable::AllocValue>::FindAndRemove
          (AddressMap<HeapProfileTable::AllocValue> *this,Key key,AllocValue *removed_value)

{
  Entry *pEVar1;
  int iVar2;
  Cluster *pCVar3;
  Entry *e;
  Entry **p;
  Cluster *c;
  Number num;
  AllocValue *removed_value_local;
  Key key_local;
  AddressMap<HeapProfileTable::AllocValue> *this_local;
  
  pCVar3 = FindCluster(this,(Number)key,false);
  if (pCVar3 != (Cluster *)0x0) {
    iVar2 = BlockID((Number)key);
    for (e = (Entry *)(pCVar3->blocks + iVar2); e->next != (Entry *)0x0; e = e->next) {
      pEVar1 = e->next;
      if (pEVar1->key == key) {
        removed_value->bytes = (pEVar1->value).bytes;
        removed_value->bucket_rep = (pEVar1->value).bucket_rep;
        e->next = pEVar1->next;
        pEVar1->next = this->free_;
        this->free_ = pEVar1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool AddressMap<Value>::FindAndRemove(Key key, Value* removed_value) {
  const Number num = reinterpret_cast<Number>(key);
  Cluster* const c = FindCluster(num, false/*do not create*/);
  if (c != nullptr) {
    for (Entry** p = &c->blocks[BlockID(num)]; *p != nullptr; p = &(*p)->next) {
      Entry* e = *p;
      if (e->key == key) {
        *removed_value = e->value;
        *p = e->next;         // Remove e from linked-list
        e->next = free_;      // Add e to free-list
        free_ = e;
        return true;
      }
    }
  }
  return false;
}